

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

void __thiscall
cmConditionEvaluator::cmArgumentList::
ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter>
          (cmArgumentList *this,bool value,CurrentAndTwoMoreIter args)

{
  bool in_DL;
  undefined7 in_register_00000031;
  string local_60;
  cmExpandedCommandArgument local_40;
  
  (anonymous_namespace)::bool2string_abi_cxx11_
            (&local_60,(_anonymous_namespace_ *)CONCAT71(in_register_00000031,value),in_DL);
  cmExpandedCommandArgument::cmExpandedCommandArgument(&local_40,&local_60,true);
  cmExpandedCommandArgument::operator=
            ((cmExpandedCommandArgument *)(args.current._M_node + 1),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::erase
            (&this->
              super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
             (const_iterator)args.next._M_node);
  return;
}

Assistant:

void ReduceOneArg(const bool value, Iter args)
  {
    *args.current = cmExpandedCommandArgument(bool2string(value), true);
    this->erase(args.next);
  }